

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O2

void __thiscall hello::devide(hello *this,boundary_type type,string *str,char *name)

{
  base_iterator begin;
  size_type sVar1;
  ostream *poVar2;
  ssegment_index ind;
  segment_index<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  iterator local_68;
  
  cppcms::application::response();
  poVar2 = (ostream *)cppcms::http::response::out();
  poVar2 = std::operator<<(poVar2,name);
  std::operator<<(poVar2,":");
  begin._M_current = (str->_M_dataplus)._M_p;
  sVar1 = str->_M_string_length;
  cppcms::application::context();
  cppcms::http::context::locale();
  booster::locale::boundary::
  segment_index<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::segment_index(&local_d0,type,begin,(base_iterator)(begin._M_current + sVar1),(locale *)&local_a8
                 );
  std::locale::~locale((locale *)&local_a8);
  booster::locale::boundary::
  segment_index<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin(&local_68,&local_d0);
  local_a8.value_.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current =
       local_68.value_.
       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .first._M_current;
  local_a8.value_.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current =
       local_68.value_.
       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .second._M_current;
  local_a8.value_.rule_ = local_68.value_.rule_;
  local_a8.current_.first = local_68.current_.first;
  local_a8.current_.second = local_68.current_.second;
  local_a8.map_._0_5_ = local_68.map_._0_5_;
  local_a8.map_._5_3_ = local_68.map_._5_3_;
  while( true ) {
    booster::locale::boundary::
    segment_index<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end(&local_68,&local_d0);
    if ((CONCAT35(local_a8.map_._5_3_,local_a8.map_._0_5_) ==
         CONCAT35(local_68.map_._5_3_,local_68.map_._0_5_)) &&
       (local_a8.current_.second == local_68.current_.second)) break;
    cppcms::application::response();
    poVar2 = (ostream *)cppcms::http::response::out();
    poVar2 = std::operator<<(poVar2,"|");
    booster::locale::boundary::operator<<(poVar2,&local_a8.value_);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::increment(&local_a8);
  }
  cppcms::application::response();
  poVar2 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar2,"|<br>\n");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d0.map_.index_.
              super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void devide(cppcms::locale::boundary::boundary_type type,std::string const &str,char const *name)
	{
		response().out()<<name<<":";
		using namespace cppcms::locale::boundary;
		ssegment_index ind(type,str.begin(),str.end(),context().locale());

		ssegment_index::iterator p;

		for(p=ind.begin();p!=ind.end();++p) {
			response().out()<<"|"<<*p;
		}
		response().out()<<"|<br>\n";
	}